

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_getdate(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  tm *ptVar10;
  jx9_value *pjVar11;
  jx9_value *pArray;
  time_t tVar12;
  time_t t;
  anon_union_8_3_18420de5_for_x local_40;
  jx9_context *local_38;
  
  if (nArg < 1) {
    time(&local_40.iVal);
  }
  else {
    pjVar11 = *apArg;
    if ((pjVar11->iFlags & 2) != 0) {
      jx9MemObjToInteger(pjVar11);
      local_40 = pjVar11->x;
      ptVar10 = localtime(&local_40.iVal);
      if (ptVar10 != (tm *)0x0) goto LAB_00133734;
    }
    time(&local_40.iVal);
  }
LAB_00133734:
  ptVar10 = localtime(&local_40.iVal);
  iVar1 = ptVar10->tm_hour;
  iVar2 = ptVar10->tm_sec;
  iVar3 = ptVar10->tm_min;
  iVar4 = ptVar10->tm_mon;
  iVar5 = ptVar10->tm_mday;
  iVar6 = ptVar10->tm_year;
  iVar7 = ptVar10->tm_yday;
  iVar8 = ptVar10->tm_wday;
  pjVar11 = jx9_context_new_scalar(pCtx);
  if (pjVar11 == (jx9_value *)0x0) {
    pjVar11 = pCtx->pRet;
  }
  else {
    pArray = jx9_context_new_array(pCtx);
    if (pArray != (jx9_value *)0x0) {
      local_38 = pCtx;
      jx9MemObjRelease(pjVar11);
      pjVar11->x = (anon_union_8_3_18420de5_for_x)(long)iVar2;
      pjVar11->iFlags = pjVar11->iFlags & 0xfffffe90U | 2;
      jx9_array_add_strkey_elem(pArray,"seconds",pjVar11);
      jx9MemObjRelease(pjVar11);
      pjVar11->x = (anon_union_8_3_18420de5_for_x)(long)iVar3;
      pjVar11->iFlags = pjVar11->iFlags & 0xfffffe90U | 2;
      jx9_array_add_strkey_elem(pArray,"minutes",pjVar11);
      jx9MemObjRelease(pjVar11);
      pjVar11->x = (anon_union_8_3_18420de5_for_x)(long)iVar1;
      pjVar11->iFlags = pjVar11->iFlags & 0xfffffe90U | 2;
      jx9_array_add_strkey_elem(pArray,"hours",pjVar11);
      jx9MemObjRelease(pjVar11);
      pjVar11->x = (anon_union_8_3_18420de5_for_x)(long)iVar5;
      pjVar11->iFlags = pjVar11->iFlags & 0xfffffe90U | 2;
      jx9_array_add_strkey_elem(pArray,"mday",pjVar11);
      jx9MemObjRelease(pjVar11);
      pjVar11->x = (anon_union_8_3_18420de5_for_x)(long)iVar8;
      pjVar11->iFlags = pjVar11->iFlags & 0xfffffe90U | 2;
      jx9_array_add_strkey_elem(pArray,"wday",pjVar11);
      jx9MemObjRelease(pjVar11);
      pjVar11->x = (anon_union_8_3_18420de5_for_x)(long)(iVar4 + 1);
      pjVar11->iFlags = pjVar11->iFlags & 0xfffffe90U | 2;
      jx9_array_add_strkey_elem(pArray,"mon",pjVar11);
      jx9MemObjRelease(pjVar11);
      pjVar11->x = (anon_union_8_3_18420de5_for_x)(long)(iVar6 + 0x76c);
      pjVar11->iFlags = pjVar11->iFlags & 0xfffffe90U | 2;
      jx9_array_add_strkey_elem(pArray,"year",pjVar11);
      jx9MemObjRelease(pjVar11);
      pjVar11->x = (anon_union_8_3_18420de5_for_x)(long)iVar7;
      pjVar11->iFlags = pjVar11->iFlags & 0xfffffe90U | 2;
      jx9_array_add_strkey_elem(pArray,"yday",pjVar11);
      jx9_value_string(pjVar11,zEngDay[iVar8 % 7],-1);
      jx9_array_add_strkey_elem(pArray,"weekday",pjVar11);
      (pjVar11->sBlob).nByte = 0;
      uVar9 = (pjVar11->sBlob).nFlags;
      if ((uVar9 & 4) != 0) {
        (pjVar11->sBlob).pBlob = (void *)0x0;
        (pjVar11->sBlob).mByte = 0;
        (pjVar11->sBlob).nFlags = uVar9 & 0xfffffffb;
      }
      jx9_value_string(pjVar11,zEngMonth[(int)(iVar4 + (((uint)(iVar4 / 6 + (iVar4 >> 0x1f)) >> 1) -
                                                       (iVar4 >> 0x1f)) * -0xc)],-1);
      jx9_array_add_strkey_elem(pArray,"month",pjVar11);
      tVar12 = time((time_t *)0x0);
      jx9MemObjRelease(pjVar11);
      (pjVar11->x).iVal = tVar12;
      pjVar11->iFlags = pjVar11->iFlags & 0xfffffe90U | 2;
      if ((pArray->iFlags & 0x40) != 0) {
        HashmapInsert((jx9_hashmap *)(pArray->x).pOther,(jx9_value *)0x0,pjVar11);
      }
      jx9MemObjStore(pArray,local_38->pRet);
      return 0;
    }
    pjVar11 = pCtx->pRet;
  }
  jx9MemObjRelease(pjVar11);
  return 0;
}

Assistant:

static int jx9Builtin_getdate(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_value *pValue, *pArray;
	Sytm sTm;
	if( nArg < 1 ){
#ifdef __WINNT__
		SYSTEMTIME sOS;
		GetSystemTime(&sOS);
		SYSTEMTIME_TO_SYTM(&sOS, &sTm);
#else
		struct tm *pTm;
		time_t t;
		time(&t);
		pTm = localtime(&t);
		STRUCT_TM_TO_SYTM(pTm, &sTm);
#endif
	}else{
		/* Use the given timestamp */
		time_t t;
		struct tm *pTm;
#ifdef __WINNT__
#ifdef _MSC_VER
#if _MSC_VER >= 1400 /* Visual Studio 2005 and up */
#pragma warning(disable:4996) /* _CRT_SECURE...*/
#endif
#endif
#endif
		if( jx9_value_is_int(apArg[0]) ){
			t = (time_t)jx9_value_to_int64(apArg[0]);
			pTm = localtime(&t);
			if( pTm == 0 ){
				time(&t);
			}
		}else{
			time(&t);
		}
		pTm = localtime(&t);
		STRUCT_TM_TO_SYTM(pTm, &sTm);
	}
	/* Element value */
	pValue = jx9_context_new_scalar(pCtx);
	if( pValue == 0 ){
		/* Return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Create a new array */
	pArray = jx9_context_new_array(pCtx);
	if( pArray == 0 ){
		/* Return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Fill the array */
	/* Seconds */
	jx9_value_int(pValue, sTm.tm_sec);
	jx9_array_add_strkey_elem(pArray, "seconds", pValue);
	/* Minutes */
	jx9_value_int(pValue, sTm.tm_min);
	jx9_array_add_strkey_elem(pArray, "minutes", pValue);
	/* Hours */
	jx9_value_int(pValue, sTm.tm_hour);
	jx9_array_add_strkey_elem(pArray, "hours", pValue);
	/* mday */
	jx9_value_int(pValue, sTm.tm_mday);
	jx9_array_add_strkey_elem(pArray, "mday", pValue);
	/* wday */
	jx9_value_int(pValue, sTm.tm_wday);
	jx9_array_add_strkey_elem(pArray, "wday", pValue);
	/* mon */
	jx9_value_int(pValue, sTm.tm_mon+1);
	jx9_array_add_strkey_elem(pArray, "mon", pValue);
	/* year */
	jx9_value_int(pValue, sTm.tm_year);
	jx9_array_add_strkey_elem(pArray, "year", pValue);
	/* yday */
	jx9_value_int(pValue, sTm.tm_yday);
	jx9_array_add_strkey_elem(pArray, "yday", pValue);
	/* Weekday */
	jx9_value_string(pValue, SyTimeGetDay(sTm.tm_wday), -1);
	jx9_array_add_strkey_elem(pArray, "weekday", pValue);
	/* Month */
	jx9_value_reset_string_cursor(pValue);
	jx9_value_string(pValue, SyTimeGetMonth(sTm.tm_mon), -1);
	jx9_array_add_strkey_elem(pArray, "month", pValue);
	/* Seconds since the epoch */
	jx9_value_int64(pValue, (jx9_int64)time(0));
	jx9_array_add_elem(pArray, 0 /* Index zero */, pValue);
	/* Return the freshly created array */
	jx9_result_value(pCtx, pArray);
	return JX9_OK;
}